

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O3

double __thiscall re2::trunc_abi_cxx11_(re2 *this,double __x)

{
  int iVar1;
  char *pcVar2;
  undefined4 uVar3;
  long lVar4;
  long *plVar5;
  long *plVar6;
  StringPiece *in_RSI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 uVar7;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 uVar8;
  StringPiece SVar9;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  iVar1 = in_RSI->length_;
  if ((long)iVar1 < 100) {
    pcVar2 = in_RSI->ptr_;
    *(re2 **)this = this + 0x10;
    std::__cxx11::string::_M_construct<char_const*>(SUB84(__x,0),this,pcVar2,pcVar2 + iVar1);
    return (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  }
  SVar9 = StringPiece::substr(in_RSI,0,100);
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,SVar9.ptr_,SVar9.ptr_ + SVar9.length_);
  plVar5 = (long *)std::__cxx11::string::append((char *)local_38);
  *(re2 **)this = this + 0x10;
  plVar6 = plVar5 + 2;
  if ((long *)*plVar5 == plVar6) {
    uVar7 = (undefined4)*plVar6;
    uVar8 = *(undefined4 *)((long)plVar5 + 0x14);
    lVar4 = plVar5[3];
    uVar3 = *(undefined4 *)((long)plVar5 + 0x1c);
    *(undefined4 *)(this + 0x10) = uVar7;
    *(undefined4 *)(this + 0x14) = uVar8;
    *(int *)(this + 0x18) = (int)lVar4;
    *(undefined4 *)(this + 0x1c) = uVar3;
  }
  else {
    *(long **)this = (long *)*plVar5;
    *(long *)(this + 0x10) = *plVar6;
    uVar7 = extraout_XMM0_Da_00;
    uVar8 = extraout_XMM0_Db_00;
  }
  *(long *)(this + 8) = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
    uVar7 = extraout_XMM0_Da_01;
    uVar8 = extraout_XMM0_Db_01;
  }
  return (double)CONCAT44(uVar8,uVar7);
}

Assistant:

static string trunc(const StringPiece& pattern) {
  if (pattern.size() < 100)
    return pattern.as_string();
  return pattern.substr(0, 100).as_string() + "...";
}